

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

SearchResult<int,_false> __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
::linear_search_impl<int,phmap::Less<int>>
          (btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>
           *this,int *k,int s,int e)

{
  int iVar1;
  long lVar2;
  
  iVar1 = s;
  if (s < e) {
    if (((ulong)this & 7) != 0) {
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                    ,0xf84,
                    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, std::basic_string<char>, phmap::Less<int>, std::allocator<std::pair<const int, std::basic_string<char>>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, std::basic_string<char>>, phmap::priv::btree_node<phmap::priv::map_params<int, std::basic_string<char>, phmap::Less<int>, std::allocator<std::pair<const int, std::basic_string<char>>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, std::basic_string<char>, phmap::Less<int>, std::allocator<std::pair<const int, std::basic_string<char>>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, std::basic_string<char>>, phmap::priv::btree_node<phmap::priv::map_params<int, std::basic_string<char>, phmap::Less<int>, std::allocator<std::pair<const int, std::basic_string<char>>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                   );
    }
    this = this + (long)s * 0x28 + 0x10;
    lVar2 = 0;
    do {
      if (*k <= *(int *)this) {
        return (SearchResult<int,_false>)(s - (int)lVar2);
      }
      lVar2 = lVar2 + -1;
      this = this + 0x28;
      iVar1 = e;
    } while ((long)s - (long)e != lVar2);
  }
  return (SearchResult<int,_false>)iVar1;
}

Assistant:

SearchResult<int, false> linear_search_impl(
            const K &k, int s, const int e, const Compare &comp,
            std::false_type /* IsCompareTo */) const {
            while (s < e) {
                if (!comp(key(s), k)) {
                    break;
                }
                ++s;
            }
            return {s};
        }